

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedFP64Case2::Run(AdvancedFP64Case2 *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  long lVar5;
  bool *compile_error;
  undefined8 *puVar6;
  string *psVar7;
  long lVar8;
  byte bVar9;
  int data;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  
  bVar9 = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "\nlayout(local_size_x = 1) in;\nbuffer Result {\n  int g_result;\n};\nuniform double g_0;\nuniform dvec2 g_1;\nuniform dvec3 g_2;\nuniform dvec4 g_3;\nuniform dmat2 g_4;\nuniform dmat2x3 g_5;\nuniform dmat2x4 g_6;\nuniform dmat3x2 g_7;\nuniform dmat3 g_8;\nuniform dmat3x4 g_9;\nuniform dmat4x2 g_10;\nuniform dmat4x3 g_11;\nuniform dmat4 g_12;\n\nvoid main() {\n  g_result = 1;\n\n  if (g_0 != 1.0LF) g_result = 0;\n  if (g_1 != dvec2(2.0LF, 3.0LF)) g_result = 0;\n  if (g_2 != dvec3(4.0LF, 5.0LF, 6.0LF)) g_result = 0;\n  if (g_3 != dvec4(7.0LF, 8.0LF, 9.0LF, 10.0LF)) g_result = 0;\n\n  if (g_4 != dmat2(11.0LF, 12.0LF, 13.0LF, 14.0LF)) g_result = 0;\n  if (g_5 != dmat2x3(15.0LF, 16.0LF, 17.0LF, 18.0LF, 19.0LF, 20.0LF)) g_result = 0;\n  if (g_6 != dmat2x4(21.0LF, 22.0LF, 23.0LF, 24.0LF, 25.0LF, 26.0LF, 27.0LF, 28.0LF)) g_result = 0;\n\n  if (g_7 != dmat3x2(29.0LF, 30.0LF, 31.0LF, 32.0LF, 33.0LF, 34.0LF)) g_result = 0;\n  if (g_8 != dmat3(35.0LF, 36.0LF, 37.0LF, 38.0LF, 39.0LF, 40.0LF, 41.0LF, 42.0LF, 43.0LF)) g_result = 0;\n  if (g_9 != dmat3x4(44.0LF, 45.0LF, 46.0LF, 47.0LF, 48.0LF, 49.0LF, 50.0LF, 51.0LF, 52.0LF, 53.0LF, 54.0LF, 55.0LF)) g_result = 0;\n\n  if (g_10 != dmat4x2(56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0)) g_result = 0;\n  if (g_11 != dmat4x3(63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0)) g_result = 0;\n  if (g_12 != dmat4(75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0, 83.0, 84.0, 85.0, 86.0, 87.0, 88.0, 89.0, 90.0)) g_result = 0;\n}"
             ,"");
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_b8);
  this->m_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar8 = -1;
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    local_b8._M_dataplus._M_p._0_4_ = 0x7b;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&local_b8,0x88e4);
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_0");
    glu::CallLogWrapper::glProgramUniform1d(this_00,GVar3,GVar4,1.0);
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_1");
    glu::CallLogWrapper::glProgramUniform2d(this_00,GVar3,GVar4,2.0,3.0);
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_2");
    glu::CallLogWrapper::glProgramUniform3d(this_00,GVar3,GVar4,4.0,5.0,6.0);
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_3");
    glu::CallLogWrapper::glProgramUniform4d(this_00,GVar3,GVar4,7.0,8.0,9.0,10.0);
    local_b8.field_2._M_allocated_capacity = 0x402a000000000000;
    local_b8.field_2._8_8_ = 0x402c000000000000;
    local_b8._M_dataplus._M_p = (pointer)0x4026000000000000;
    local_b8._M_string_length = 0x4028000000000000;
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_4");
    glu::CallLogWrapper::glProgramUniformMatrix2dv(this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8)
    ;
    local_b8._M_dataplus._M_p = (pointer)0x402e000000000000;
    local_b8._M_string_length = 0x4030000000000000;
    local_b8.field_2._M_allocated_capacity = 0x4031000000000000;
    local_b8.field_2._8_8_ = 0x4032000000000000;
    local_98 = 0x4033000000000000;
    uStack_90 = 0x4034000000000000;
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_5");
    glu::CallLogWrapper::glProgramUniformMatrix2x3dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    local_88 = 0x403b000000000000;
    uStack_80 = 0x403c000000000000;
    local_98 = 0x4039000000000000;
    uStack_90 = 0x403a000000000000;
    local_b8.field_2._M_allocated_capacity = 0x4037000000000000;
    local_b8.field_2._8_8_ = 0x4038000000000000;
    local_b8._M_dataplus._M_p = (pointer)0x4035000000000000;
    local_b8._M_string_length = 0x4036000000000000;
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_6");
    glu::CallLogWrapper::glProgramUniformMatrix2x4dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    local_b8._M_dataplus._M_p = (pointer)0x403d000000000000;
    local_b8._M_string_length = 0x403e000000000000;
    local_b8.field_2._M_allocated_capacity = 0x403f000000000000;
    local_b8.field_2._8_8_ = 0x4040000000000000;
    local_98 = 0x4040800000000000;
    uStack_90 = 0x4041000000000000;
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_7");
    glu::CallLogWrapper::glProgramUniformMatrix3x2dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    puVar6 = &DAT_01a79e50;
    psVar7 = &local_b8;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      psVar7->_M_dataplus = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_8");
    glu::CallLogWrapper::glProgramUniformMatrix3dv(this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8)
    ;
    puVar6 = &DAT_01a79ea0;
    psVar7 = &local_b8;
    for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
      psVar7->_M_dataplus = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_9");
    glu::CallLogWrapper::glProgramUniformMatrix3x4dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    local_88 = 0x404f000000000000;
    uStack_80 = 0x404f800000000000;
    local_98 = 0x404e000000000000;
    uStack_90 = 0x404e800000000000;
    local_b8.field_2._M_allocated_capacity = 0x404d000000000000;
    local_b8.field_2._8_8_ = 0x404d800000000000;
    local_b8._M_dataplus._M_p = (pointer)0x404c000000000000;
    local_b8._M_string_length = 0x404c800000000000;
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_10");
    glu::CallLogWrapper::glProgramUniformMatrix4x2dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    puVar6 = &DAT_01a79f40;
    psVar7 = &local_b8;
    for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
      psVar7->_M_dataplus = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_11");
    glu::CallLogWrapper::glProgramUniformMatrix4x3dv
              (this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8);
    puVar6 = &DAT_01a79fa0;
    psVar7 = &local_b8;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      psVar7->_M_dataplus = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    GVar3 = this->m_program;
    GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar3,"g_12");
    glu::CallLogWrapper::glProgramUniformMatrix4dv(this_00,GVar3,GVar4,1,'\0',(GLdouble *)&local_b8)
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&local_b8);
    if ((int)local_b8._M_dataplus._M_p == 1) {
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
      local_b8._M_dataplus._M_p._0_4_ = 0x7b;
      glu::CallLogWrapper::glBufferSubData(this_00,0x90d2,0,4,&local_b8);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_0");
      glu::CallLogWrapper::glUniform1d(this_00,GVar4,1.0);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_1");
      glu::CallLogWrapper::glUniform2d(this_00,GVar4,2.0,3.0);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_2");
      glu::CallLogWrapper::glUniform3d(this_00,GVar4,4.0,5.0,6.0);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_3");
      glu::CallLogWrapper::glUniform4d(this_00,GVar4,7.0,8.0,9.0,10.0);
      local_b8.field_2._M_allocated_capacity = 0x402a000000000000;
      local_b8.field_2._8_8_ = 0x402c000000000000;
      local_b8._M_dataplus._M_p = (pointer)0x4026000000000000;
      local_b8._M_string_length = 0x4028000000000000;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_4");
      glu::CallLogWrapper::glUniformMatrix2dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      local_b8._M_dataplus._M_p = (pointer)0x402e000000000000;
      local_b8._M_string_length = 0x4030000000000000;
      local_b8.field_2._M_allocated_capacity = 0x4031000000000000;
      local_b8.field_2._8_8_ = 0x4032000000000000;
      local_98 = 0x4033000000000000;
      uStack_90 = 0x4034000000000000;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_5");
      glu::CallLogWrapper::glUniformMatrix2x3dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      local_88 = 0x403b000000000000;
      uStack_80 = 0x403c000000000000;
      local_98 = 0x4039000000000000;
      uStack_90 = 0x403a000000000000;
      local_b8.field_2._M_allocated_capacity = 0x4037000000000000;
      local_b8.field_2._8_8_ = 0x4038000000000000;
      local_b8._M_dataplus._M_p = (pointer)0x4035000000000000;
      local_b8._M_string_length = 0x4036000000000000;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_6");
      glu::CallLogWrapper::glUniformMatrix2x4dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      local_b8._M_dataplus._M_p = (pointer)0x403d000000000000;
      local_b8._M_string_length = 0x403e000000000000;
      local_b8.field_2._M_allocated_capacity = 0x403f000000000000;
      local_b8.field_2._8_8_ = 0x4040000000000000;
      local_98 = 0x4040800000000000;
      uStack_90 = 0x4041000000000000;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_7");
      glu::CallLogWrapper::glUniformMatrix3x2dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      puVar6 = &DAT_01a79e50;
      psVar7 = &local_b8;
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        psVar7->_M_dataplus = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_8");
      glu::CallLogWrapper::glUniformMatrix3dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      puVar6 = &DAT_01a79ea0;
      psVar7 = &local_b8;
      for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
        psVar7->_M_dataplus = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_9");
      glu::CallLogWrapper::glUniformMatrix3x4dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      local_88 = 0x404f000000000000;
      uStack_80 = 0x404f800000000000;
      local_98 = 0x404e000000000000;
      uStack_90 = 0x404e800000000000;
      local_b8.field_2._M_allocated_capacity = 0x404d000000000000;
      local_b8.field_2._8_8_ = 0x404d800000000000;
      local_b8._M_dataplus._M_p = (pointer)0x404c000000000000;
      local_b8._M_string_length = 0x404c800000000000;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_10");
      glu::CallLogWrapper::glUniformMatrix4x2dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      puVar6 = &DAT_01a79f40;
      psVar7 = &local_b8;
      for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
        psVar7->_M_dataplus = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_11");
      glu::CallLogWrapper::glUniformMatrix4x3dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      puVar6 = &DAT_01a79fa0;
      psVar7 = &local_b8;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        psVar7->_M_dataplus = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        psVar7 = (string *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_12");
      glu::CallLogWrapper::glUniformMatrix4dv(this_00,GVar4,1,'\0',(GLdouble *)&local_b8);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&local_b8);
      iVar1 = (int)local_b8._M_dataplus._M_p;
      if ((int)local_b8._M_dataplus._M_p != 1) {
        anon_unknown_0::Output
                  ("Data is %d should be 1.\n",(ulong)local_b8._M_dataplus._M_p & 0xffffffff);
      }
      lVar8 = -(ulong)(iVar1 != 1);
    }
    else {
      anon_unknown_0::Output("Data is %d should be 1.\n");
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(local_size_x = 1) in;" NL "buffer Result {" NL "  int g_result;" NL "};" NL "uniform double g_0;" NL
			"uniform dvec2 g_1;" NL "uniform dvec3 g_2;" NL "uniform dvec4 g_3;" NL "uniform dmat2 g_4;" NL
			"uniform dmat2x3 g_5;" NL "uniform dmat2x4 g_6;" NL "uniform dmat3x2 g_7;" NL "uniform dmat3 g_8;" NL
			"uniform dmat3x4 g_9;" NL "uniform dmat4x2 g_10;" NL "uniform dmat4x3 g_11;" NL "uniform dmat4 g_12;" NL NL
			"void main() {" NL "  g_result = 1;" NL NL "  if (g_0 != 1.0LF) g_result = 0;" NL
			"  if (g_1 != dvec2(2.0LF, 3.0LF)) g_result = 0;" NL
			"  if (g_2 != dvec3(4.0LF, 5.0LF, 6.0LF)) g_result = 0;" NL
			"  if (g_3 != dvec4(7.0LF, 8.0LF, 9.0LF, 10.0LF)) g_result = 0;" NL NL
			"  if (g_4 != dmat2(11.0LF, 12.0LF, 13.0LF, 14.0LF)) g_result = 0;" NL
			"  if (g_5 != dmat2x3(15.0LF, 16.0LF, 17.0LF, 18.0LF, 19.0LF, 20.0LF)) g_result = 0;" NL
			"  if (g_6 != dmat2x4(21.0LF, 22.0LF, 23.0LF, 24.0LF, 25.0LF, 26.0LF, 27.0LF, 28.0LF)) g_result = 0;" NL NL
			"  if (g_7 != dmat3x2(29.0LF, 30.0LF, 31.0LF, 32.0LF, 33.0LF, 34.0LF)) g_result = 0;" NL
			"  if (g_8 != dmat3(35.0LF, 36.0LF, 37.0LF, 38.0LF, 39.0LF, 40.0LF, 41.0LF, 42.0LF, 43.0LF)) g_result = "
			"0;" NL "  if (g_9 != dmat3x4(44.0LF, 45.0LF, 46.0LF, 47.0LF, 48.0LF, 49.0LF, 50.0LF, 51.0LF, 52.0LF, "
			"53.0LF, 54.0LF, 55.0LF)) g_result = 0;" NL NL
			"  if (g_10 != dmat4x2(56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0)) g_result = 0;" NL
			"  if (g_11 != dmat4x3(63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0)) g_result = "
			"0;" NL "  if (g_12 != dmat4(75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0, 83.0, 84.0, 85.0, 86.0, 87.0, "
			"88.0, 89.0, 90.0)) g_result = 0;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		/* create buffer */
		{
			const int data = 123;
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glProgramUniform1d(m_program, glGetUniformLocation(m_program, "g_0"), 1.0);
		glProgramUniform2d(m_program, glGetUniformLocation(m_program, "g_1"), 2.0, 3.0);
		glProgramUniform3d(m_program, glGetUniformLocation(m_program, "g_2"), 4.0, 5.0, 6.0);
		glProgramUniform4d(m_program, glGetUniformLocation(m_program, "g_3"), 7.0, 8.0, 9.0, 10.0);

		/* mat2 */
		{
			const GLdouble value[4] = { 11.0, 12.0, 13.0, 14.0 };
			glProgramUniformMatrix2dv(m_program, glGetUniformLocation(m_program, "g_4"), 1, GL_FALSE, value);
		}
		/* mat2x3 */
		{
			const GLdouble value[6] = { 15.0, 16.0, 17.0, 18.0, 19.0, 20.0 };
			glProgramUniformMatrix2x3dv(m_program, glGetUniformLocation(m_program, "g_5"), 1, GL_FALSE, value);
		}
		/* mat2x4 */
		{
			const GLdouble value[8] = { 21.0, 22.0, 23.0, 24.0, 25.0, 26.0, 27.0, 28.0 };
			glProgramUniformMatrix2x4dv(m_program, glGetUniformLocation(m_program, "g_6"), 1, GL_FALSE, value);
		}

		/* mat3x2 */
		{
			const GLdouble value[6] = { 29.0, 30.0, 31.0, 32.0, 33.0, 34.0 };
			glProgramUniformMatrix3x2dv(m_program, glGetUniformLocation(m_program, "g_7"), 1, GL_FALSE, value);
		}
		/* mat3 */
		{
			const GLdouble value[9] = { 35.0, 36.0, 37.0, 38.0, 39.0, 40.0, 41.0, 42.0, 43.0 };
			glProgramUniformMatrix3dv(m_program, glGetUniformLocation(m_program, "g_8"), 1, GL_FALSE, value);
		}
		/* mat3x4 */
		{
			const GLdouble value[12] = { 44.0, 45.0, 46.0, 47.0, 48.0, 49.0, 50.0, 51.0, 52.0, 53.0, 54.0, 55.0 };
			glProgramUniformMatrix3x4dv(m_program, glGetUniformLocation(m_program, "g_9"), 1, GL_FALSE, value);
		}

		/* mat4x2 */
		{
			const GLdouble value[8] = { 56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0 };
			glProgramUniformMatrix4x2dv(m_program, glGetUniformLocation(m_program, "g_10"), 1, GL_FALSE, value);
		}
		/* mat4x3 */
		{
			const GLdouble value[12] = { 63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0 };
			glProgramUniformMatrix4x3dv(m_program, glGetUniformLocation(m_program, "g_11"), 1, GL_FALSE, value);
		}
		/* mat4 */
		{
			const GLdouble value[16] = { 75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0,
										 83.0, 84.0, 85.0, 86.0, 87.0, 88.0, 89.0, 90.0 };
			glProgramUniformMatrix4dv(m_program, glGetUniformLocation(m_program, "g_12"), 1, GL_FALSE, value);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		// re-link program (all uniforms will be set to zero)
		glLinkProgram(m_program);

		/* clear buffer */
		{
			const int data = 123;
			glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
		}

		glUniform1d(glGetUniformLocation(m_program, "g_0"), 1.0);
		glUniform2d(glGetUniformLocation(m_program, "g_1"), 2.0, 3.0);
		glUniform3d(glGetUniformLocation(m_program, "g_2"), 4.0, 5.0, 6.0);
		glUniform4d(glGetUniformLocation(m_program, "g_3"), 7.0, 8.0, 9.0, 10.0);

		/* mat2 */
		{
			const GLdouble value[4] = { 11.0, 12.0, 13.0, 14.0 };
			glUniformMatrix2dv(glGetUniformLocation(m_program, "g_4"), 1, GL_FALSE, value);
		}
		/* mat2x3 */
		{
			const GLdouble value[6] = { 15.0, 16.0, 17.0, 18.0, 19.0, 20.0 };
			glUniformMatrix2x3dv(glGetUniformLocation(m_program, "g_5"), 1, GL_FALSE, value);
		}
		/* mat2x4 */
		{
			const GLdouble value[8] = { 21.0, 22.0, 23.0, 24.0, 25.0, 26.0, 27.0, 28.0 };
			glUniformMatrix2x4dv(glGetUniformLocation(m_program, "g_6"), 1, GL_FALSE, value);
		}

		/* mat3x2 */
		{
			const GLdouble value[6] = { 29.0, 30.0, 31.0, 32.0, 33.0, 34.0 };
			glUniformMatrix3x2dv(glGetUniformLocation(m_program, "g_7"), 1, GL_FALSE, value);
		}
		/* mat3 */
		{
			const GLdouble value[9] = { 35.0, 36.0, 37.0, 38.0, 39.0, 40.0, 41.0, 42.0, 43.0 };
			glUniformMatrix3dv(glGetUniformLocation(m_program, "g_8"), 1, GL_FALSE, value);
		}
		/* mat3x4 */
		{
			const GLdouble value[12] = { 44.0, 45.0, 46.0, 47.0, 48.0, 49.0, 50.0, 51.0, 52.0, 53.0, 54.0, 55.0 };
			glUniformMatrix3x4dv(glGetUniformLocation(m_program, "g_9"), 1, GL_FALSE, value);
		}

		/* mat4x2 */
		{
			const GLdouble value[8] = { 56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0 };
			glUniformMatrix4x2dv(glGetUniformLocation(m_program, "g_10"), 1, GL_FALSE, value);
		}
		/* mat4x3 */
		{
			const GLdouble value[12] = { 63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0 };
			glUniformMatrix4x3dv(glGetUniformLocation(m_program, "g_11"), 1, GL_FALSE, value);
		}
		/* mat4 */
		{
			const GLdouble value[16] = { 75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0,
										 83.0, 84.0, 85.0, 86.0, 87.0, 88.0, 89.0, 90.0 };
			glUniformMatrix4dv(glGetUniformLocation(m_program, "g_12"), 1, GL_FALSE, value);
		}

		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		return NO_ERROR;
	}